

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcWallType::~IfcWallType(IfcWallType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)this = 0x8a9420;
  *(undefined8 *)&this->field_0x1c0 = 0x8a9538;
  *(undefined8 *)&this->field_0x88 = 0x8a9448;
  *(undefined8 *)&this->field_0x98 = 0x8a9470;
  *(undefined8 *)&this->field_0xf0 = 0x8a9498;
  *(undefined8 *)&this->field_0x148 = 0x8a94c0;
  *(undefined8 *)&this->field_0x180 = 0x8a94e8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWallType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x8a9510;
  puVar1 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWallType,_1UL>).field_0x10;
  if (puVar1 != &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWallType,_1UL>).field_0x20) {
    operator_delete(puVar1);
  }
  *(undefined8 *)this = 0x8a9800;
  *(undefined8 *)&this->field_0x1c0 = 0x8a98c8;
  *(undefined8 *)&this->field_0x88 = 0x8a9828;
  *(undefined8 *)&this->field_0x98 = 0x8a9850;
  *(undefined8 *)&this->field_0xf0 = 0x8a9878;
  *(undefined8 *)&this->field_0x148 = 0x8a98a0;
  if (*(undefined1 **)&this->field_0x158 != &this->field_0x168) {
    operator_delete(*(undefined1 **)&this->field_0x158);
  }
  IfcTypeProduct::~IfcTypeProduct((IfcTypeProduct *)this,&PTR_construction_vtable_24__008a9560);
  operator_delete(this);
  return;
}

Assistant:

IfcWallType() : Object("IfcWallType") {}